

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O1

int __thiscall GeneticAlgorithm::init(GeneticAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  pointer pvVar1;
  time_t tVar2;
  pointer __s;
  __node_base _Var3;
  pointer extraout_RAX;
  pointer pEVar4;
  int iVar5;
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> *in_RDX;
  GeneticAlgorithm *pGVar6;
  pointer pEVar7;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_float>,_false>_>_>
  _Stack_128;
  pointer pEStack_120;
  int iStack_118;
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_110;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_d8;
  float fStack_a0;
  GeneticAlgorithm *pGStack_98;
  undefined8 uStack_90;
  pointer pvStack_88;
  undefined1 *puStack_80;
  pointer pvStack_78;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_68;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_48;
  
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::operator=
            (&(this->dataCenter).caches,in_RDX);
  std::vector<Endpoint,_std::allocator<Endpoint>_>::operator=
            (&(this->dataCenter).endpoint,
             (vector<Endpoint,_std::allocator<Endpoint>_> *)(in_RDX + 1));
  std::vector<Video,_std::allocator<Video>_>::operator=
            (&(this->dataCenter).videos,(vector<Video,_std::allocator<Video>_> *)(in_RDX + 2));
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  findNumberOfRequests(this);
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = (pointer)operator_new(0x2580);
  pvVar1 = __s + 400;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar1;
  memset(__s,0,0x2580);
  local_48.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->population).
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->population).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar1;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_68);
  pGVar6 = this;
  generateInitialPopulation(this,200);
  uStack_90 = 0;
  pEVar7 = (pGVar6->dataCenter).endpoint.super__Vector_base<Endpoint,_std::allocator<Endpoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (pGVar6->dataCenter).endpoint.super__Vector_base<Endpoint,_std::allocator<Endpoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar7 != pEVar4) {
    pEStack_120 = pEVar4;
    pGStack_98 = this;
    pvStack_88 = pvVar1;
    puStack_80 = (undefined1 *)&local_68;
    pvStack_78 = __s;
    do {
      iStack_118 = pEVar7->id;
      _Stack_110._M_buckets = (__buckets_ptr)0x0;
      _Stack_110._M_bucket_count = (pEVar7->cacheLatency)._M_h._M_bucket_count;
      _Stack_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_110._M_element_count = (pEVar7->cacheLatency)._M_h._M_element_count;
      _Stack_110._M_rehash_policy._M_max_load_factor =
           (pEVar7->cacheLatency)._M_h._M_rehash_policy._M_max_load_factor;
      _Stack_110._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pEVar7->cacheLatency)._M_h._M_rehash_policy.field_0x4;
      _Stack_110._M_rehash_policy._M_next_resize =
           (pEVar7->cacheLatency)._M_h._M_rehash_policy._M_next_resize;
      _Stack_110._M_single_bucket = (__node_base_ptr)0x0;
      _Stack_128._M_h = (__hashtable_alloc *)&_Stack_110;
      std::
      _Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,float>,false>>>>
                ((_Hashtable<int,std::pair<int_const,float>,std::allocator<std::pair<int_const,float>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&_Stack_110,&(pEVar7->cacheLatency)._M_h,&_Stack_128);
      _Stack_d8._M_buckets = (__buckets_ptr)0x0;
      _Stack_d8._M_bucket_count = (pEVar7->requests)._M_h._M_bucket_count;
      _Stack_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_d8._M_element_count = (pEVar7->requests)._M_h._M_element_count;
      _Stack_d8._M_rehash_policy._M_max_load_factor =
           (pEVar7->requests)._M_h._M_rehash_policy._M_max_load_factor;
      _Stack_d8._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pEVar7->requests)._M_h._M_rehash_policy.field_0x4;
      _Stack_d8._M_rehash_policy._M_next_resize =
           (pEVar7->requests)._M_h._M_rehash_policy._M_next_resize;
      _Stack_d8._M_single_bucket = (__node_base_ptr)0x0;
      _Stack_128._M_h = (__hashtable_alloc *)&_Stack_d8;
      std::
      _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&_Stack_d8,&(pEVar7->requests)._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_>
                  *)&_Stack_128);
      fStack_a0 = pEVar7->serverLatency;
      if (_Stack_d8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        iVar5 = pGVar6->numberOfRequests;
        _Var3._M_nxt = _Stack_d8._M_before_begin._M_nxt;
        do {
          iVar5 = iVar5 + *(int *)((long)&_Var3._M_nxt[1]._M_nxt + 4);
          _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
        } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
        pGVar6->numberOfRequests = iVar5;
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_d8);
      std::
      _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_110);
      pEVar7 = pEVar7 + 1;
      pEVar4 = extraout_RAX;
    } while (pEVar7 != pEStack_120);
  }
  return (int)pEVar4;
}

Assistant:

void GeneticAlgorithm::init(int generations, DataCenter dataCenter) {
    this->dataCenter = dataCenter ;
    srand (time(NULL));
    findNumberOfRequests();
    this->population = std::vector<std::vector<std::string>>(POPULATION_SIZE * 2);
    this->generateInitialPopulation(POPULATION_SIZE);
    for (int i = 0; i < generations; ++i) {
        std::cout << "Geração " << i << std::endl;
     //   std::cout << "Iniciando Cross" << std::endl;
        crossover();
      //  std::cout << "Iniciando Mut" << std::endl;

        mutation();
      //  std::cout << "Iniciando Sel" << std::endl;

        selection();
    }
    std::cout << "Pop Size" << this->population.size() << " "  << std::endl;

    for (std::vector<std::string> strings : this->population) {
        for(std::string string : strings){
            std::cout << string << " " ;
        }

        std::cout << std::endl;
        fitness(strings);
    }
    std::cout << "Best : " ;
    for(std::string string : bestSolution){
        std::cout << string << " " ;
    }

    std::cout << std::endl;
    std::cout << "Fitness == " << fitness(bestSolution) * -1 * 1000<< std::endl;

}